

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O2

void __thiscall
cnn::ShadowLookupParameters::ShadowLookupParameters
          (ShadowLookupParameters *this,LookupParameters *lp)

{
  pointer pTVar1;
  uint uVar2;
  float *pfVar3;
  vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *__range1;
  Tensor *t;
  pointer d;
  
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(&this->h,&lp->values);
  pTVar1 = (this->h).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (d = (this->h).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
           super__Vector_impl_data._M_start; d != pTVar1; d = d + 1) {
    uVar2 = Dim::size(&d->d);
    pfVar3 = (float *)cnn_mm_malloc((ulong)uVar2 << 2,0x100);
    d->v = pfVar3;
    TensorTools::Zero(d);
  }
  return;
}

Assistant:

ShadowLookupParameters::ShadowLookupParameters(const LookupParameters& lp) : h(lp.values) {
  for (auto& t : h) {
    t.v = (float*)cnn_mm_malloc(t.d.size() * sizeof(float), 256);
    TensorTools::Zero(t);
  }
}